

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VCFrontEnd.h
# Opt level: O1

double __thiscall VCTools::InputParser::getFloatArg(InputParser *this,string *arg,double def)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  char *pcVar2;
  string nr;
  double local_30;
  string local_28;
  
  getCmdOption(&local_28,this,arg);
  local_30 = def;
  if (local_28._M_string_length != 0) {
    pcVar2 = local_28._M_dataplus._M_p + local_28._M_string_length;
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<VCTools::InputParser::getFloatArg(std::__cxx11::string_const&,double)::_lambda(unsigned_char)_1_>>
                      (local_28._M_dataplus._M_p,pcVar2);
    if (_Var1._M_current == pcVar2) {
      local_30 = atof(local_28._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return local_30;
}

Assistant:

double getFloatArg(const string& arg, double def = -1) {
			string nr = getCmdOption(arg);
			if (nr.size() > 0 && std::all_of(nr.begin(), nr.end(), 
				[](unsigned char c) {return ::isdigit(c) || c == '.'; }))
				return atof(nr.c_str());
			return def;
		}